

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

CloudNode * Lpk_CutTruthBdd(Lpk_Man_t *p,Lpk_Cut_t *pCut)

{
  CloudManager *dd;
  Hop_Man_t *pMan;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 aVar1;
  Abc_Obj_t *pAVar2;
  CloudNode *pCVar3;
  Hop_Obj_t *pHVar4;
  CloudNode *pCVar5;
  Hop_Obj_t *pObj;
  ulong uVar6;
  long lVar7;
  
  dd = p->pDsdMan->dd;
  pMan = (Hop_Man_t *)p->pNtk->pManFunc;
  lVar7 = -1;
  for (uVar6 = 0; uVar6 < (*(uint *)pCut & 0x3f); uVar6 = uVar6 + 1) {
    pAVar2 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar6]);
    pAVar2->field_6 =
         *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
          (dd->vars + (ulong)(*(uint *)pCut & 0x3f) + lVar7);
    lVar7 = lVar7 + -1;
  }
  pCVar3 = (CloudNode *)0x0;
  uVar6 = (ulong)(*(uint *)pCut >> 6 & 0x3f);
  do {
    if ((long)uVar6 < 1) {
      return pCVar3;
    }
    pAVar2 = Abc_NtkObj(p->pNtk,pCut->pNodes[uVar6 - 1]);
    pObj = (Hop_Obj_t *)((ulong)(pAVar2->field_5).pData & 0xfffffffffffffffe);
    Hop_ObjCleanData_rec(pObj);
    for (lVar7 = 0; lVar7 < (pAVar2->vFanins).nSize; lVar7 = lVar7 + 1) {
      aVar1 = *(anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 *)
               ((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar7]] + 0x40);
      if (aVar1._2_2_ == 0) {
        __assert_fail("((unsigned)(ABC_PTRUINT_T)pFanin->pCopy) & 0xffff0000",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x6d,"CloudNode *Lpk_CutTruthBdd(Lpk_Man_t *, Lpk_Cut_t *)");
      }
      pHVar4 = Hop_ManPi(pMan,(int)lVar7);
      pHVar4->field_0 = aVar1;
    }
    pCVar5 = Lpk_CutTruthBdd_rec(dd,pMan,pObj,*(uint *)pCut & 0x3f);
    pCVar3 = (CloudNode *)((ulong)pCVar5 ^ 1);
    if (((ulong)pAVar2->field_5 & 1) == 0) {
      pCVar3 = pCVar5;
    }
    (pAVar2->field_6).pTemp = pCVar3;
    uVar6 = uVar6 - 1;
  } while( true );
}

Assistant:

CloudNode * Lpk_CutTruthBdd( Lpk_Man_t * p, Lpk_Cut_t * pCut )
{
    CloudManager * dd = p->pDsdMan->dd;
    Hop_Man_t * pManHop = (Hop_Man_t *)p->pNtk->pManFunc;
    Hop_Obj_t * pObjHop;
    Abc_Obj_t * pObj, * pFanin;
    CloudNode * pTruth = NULL; // Suppress "might be used uninitialized"
    int i, k;

//    return NULL;
//    Lpk_NodePrintCut( p, pCut );
    // initialize the leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)dd->vars[pCut->nLeaves-1-i];

    // construct truth table in the topological order
    Lpk_CutForEachNodeReverse( p->pNtk, pCut, pObj, i )
    {
        // get the local AIG
        pObjHop = Hop_Regular((Hop_Obj_t *)pObj->pData);
        // clean the data field of the nodes in the AIG subgraph
        Hop_ObjCleanData_rec( pObjHop );
        // set the initial truth tables at the fanins
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( ((unsigned)(ABC_PTRUINT_T)pFanin->pCopy) & 0xffff0000 );
            Hop_ManPi( pManHop, k )->pData = pFanin->pCopy;
        }
        // compute the truth table of internal nodes
        pTruth = Lpk_CutTruthBdd_rec( dd, pManHop, pObjHop, pCut->nLeaves );
        if ( Hop_IsComplement((Hop_Obj_t *)pObj->pData) )
            pTruth = Cloud_Not(pTruth);
        // set the truth table at the node
        pObj->pCopy = (Abc_Obj_t *)pTruth;
        
    }

//    Cloud_bddPrint( dd, pTruth );
//    printf( "Bdd size = %d. Total nodes = %d.\n", Cloud_DagSize( dd, pTruth ), dd->nNodesCur-dd->nVars-1 );
    return pTruth;
}